

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O3

void set_cmninit(feat_t *fcb,char *cmninit)

{
  char *__s;
  char *pcVar1;
  cmn_t *pcVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  
  if ((cmninit == (char *)0x0) || (fcb->cmn_struct == (cmn_t *)0x0)) {
    return;
  }
  __s = __ckd_salloc__(cmninit,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                       ,0x1a4);
  pcVar2 = fcb->cmn_struct;
  if (0 < pcVar2->veclen) {
    pcVar1 = strchr(__s,0x2c);
    pcVar3 = __s;
    if (pcVar1 == (char *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        *pcVar1 = '\0';
        dVar5 = atof(pcVar3);
        pcVar2 = fcb->cmn_struct;
        pcVar2->cmn_mean[lVar4] = (mfcc_t)(float)dVar5;
        lVar4 = lVar4 + 1;
        if (pcVar2->veclen <= lVar4) goto LAB_00110d20;
        pcVar3 = pcVar1 + 1;
        pcVar1 = strchr(pcVar3,0x2c);
      } while (pcVar1 != (char *)0x0);
    }
    if (*pcVar3 != '\0') {
      dVar5 = atof(pcVar3);
      pcVar2->cmn_mean[lVar4] = (mfcc_t)(float)dVar5;
    }
  }
LAB_00110d20:
  ckd_free(__s);
  return;
}

Assistant:

void
set_cmninit(feat_t *fcb, char const *cmninit)
{
    char *c, *cc, *vallist;
    int32 nvals;

    if (cmninit == NULL)
        return;
    if (fcb->cmn_struct == NULL)
	return;
    vallist = ckd_salloc(cmninit);
    c = vallist;
    nvals = 0;
    while (nvals < fcb->cmn_struct->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
        c = cc + 1;
        ++nvals;
    }
    if (nvals < fcb->cmn_struct->veclen && *c != '\0') {
        fcb->cmn_struct->cmn_mean[nvals] = atof(c);
    }
    ckd_free(vallist);
}